

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_xmlstring(void)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  size_t sVar13;
  undefined8 uVar14;
  int n_cur;
  uint uVar15;
  uint uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int n_len;
  undefined8 *puVar20;
  ulong uVar21;
  int n_len_2;
  int iVar22;
  char *pcVar23;
  undefined4 *puVar24;
  int test_ret_6;
  int *piVar25;
  int test_ret_2;
  int test_ret_1;
  int test_ret_7;
  int test_ret_9;
  int test_ret;
  int test_ret_8;
  int test_ret_12;
  int local_58;
  int local_50;
  int local_48;
  int local_44;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing xmlstring : 26 of 30 functions ...");
  }
  puVar20 = &DAT_00165d58;
  uVar15 = 0;
  iVar22 = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (uVar15 < 3) {
      uVar18 = *puVar20;
    }
    else {
      uVar18 = 0;
    }
    lVar12 = xmlCharStrdup(uVar18);
    if (lVar12 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCharStrdup",(ulong)(uint)(iVar4 - iVar3));
      iVar22 = iVar22 + 1;
      printf(" %d",(ulong)uVar15);
      putchar(10);
    }
    uVar15 = uVar15 + 1;
    puVar20 = puVar20 + 1;
  } while (uVar15 != 4);
  function_tests = function_tests + 1;
  iVar3 = 0;
  iVar4 = 0;
  do {
    piVar25 = &DAT_00163454;
    uVar21 = 0;
    do {
      iVar5 = xmlMemBlocks();
      if (iVar4 == 0) {
        bVar1 = false;
        pcVar23 = "foo";
      }
      else if (iVar4 == 2) {
        bVar1 = false;
        pcVar23 = "test/ent2";
      }
      else if (iVar4 == 1) {
        bVar1 = false;
        pcVar23 = "<foo/>";
      }
      else {
        bVar1 = true;
        pcVar23 = (char *)0x0;
      }
      iVar6 = -1;
      if ((uint)uVar21 < 4) {
        iVar6 = *piVar25;
      }
      if ((bVar1) || (sVar13 = strlen(pcVar23), iVar6 <= (int)sVar13 + 1)) {
        lVar12 = xmlCharStrndup(pcVar23,iVar6);
        if (lVar12 != 0) {
          (*_xmlFree)(lVar12);
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCharStrndup",(ulong)(uint)(iVar6 - iVar5));
          iVar3 = iVar3 + 1;
          printf(" %d",iVar4);
          printf(" %d",uVar21);
          putchar(10);
        }
      }
      uVar15 = (uint)uVar21 + 1;
      uVar21 = (ulong)uVar15;
      piVar25 = piVar25 + 1;
    } while (uVar15 != 4);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 4);
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  xmlCheckUTF8(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar5 = xmlMemBlocks();
  if (iVar4 != iVar5) {
    iVar6 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlCheckUTF8",(ulong)(uint)(iVar6 - iVar4));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar15 = 0;
  iVar6 = 0;
  do {
    iVar7 = xmlMemBlocks();
    uVar18 = 0;
    if (uVar15 == 0) {
      uVar18 = 0x168a14;
    }
    xmlGetUTF8Char(0,uVar18);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlGetUTF8Char",(ulong)(uint)(iVar8 - iVar7));
      iVar6 = iVar6 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar15);
      putchar(10);
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 == 1);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar15 = 0;
  do {
    puVar20 = &DAT_00165d70;
    uVar16 = 0;
    do {
      iVar8 = xmlMemBlocks();
      if (uVar15 < 4) {
        uVar18 = (&DAT_00165d70)[uVar15];
      }
      else {
        uVar18 = 0;
      }
      if (uVar16 < 4) {
        uVar19 = *puVar20;
      }
      else {
        uVar19 = 0;
      }
      xmlStrEqual(uVar18,uVar19);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrEqual",(ulong)(uint)(iVar9 - iVar8));
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
      }
      uVar16 = uVar16 + 1;
      puVar20 = puVar20 + 1;
    } while (uVar16 != 5);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  local_58 = 0;
  uVar15 = 0;
  do {
    uVar21 = 0;
    do {
      uVar16 = 0;
      puVar20 = &DAT_00165d70;
      do {
        iVar8 = xmlMemBlocks();
        if (uVar15 < 4) {
          uVar18 = (&DAT_00165d70)[uVar15];
        }
        else {
          uVar18 = 0;
        }
        if ((uint)uVar21 < 4) {
          uVar19 = (&DAT_00165d70)[uVar21];
        }
        else {
          uVar19 = 0;
        }
        if (uVar16 < 4) {
          uVar14 = *puVar20;
        }
        else {
          uVar14 = 0;
        }
        xmlStrQEqual(uVar18,uVar19,uVar14);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar9 = xmlMemBlocks();
        if (iVar8 != iVar9) {
          iVar9 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStrQEqual",(ulong)(uint)(iVar9 - iVar8));
          local_58 = local_58 + 1;
          printf(" %d",(ulong)uVar15);
          printf(" %d",uVar21);
          printf(" %d");
          putchar(10);
        }
        uVar16 = uVar16 + 1;
        puVar20 = puVar20 + 1;
      } while (uVar16 != 5);
      uVar16 = (uint)uVar21 + 1;
      uVar21 = (ulong)uVar16;
    } while (uVar16 != 5);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar15 = 0;
  do {
    puVar20 = &DAT_00165d70;
    uVar16 = 0;
    do {
      iVar9 = xmlMemBlocks();
      if (uVar15 < 4) {
        uVar18 = (&DAT_00165d70)[uVar15];
      }
      else {
        uVar18 = 0;
      }
      if (uVar16 < 4) {
        uVar19 = *puVar20;
      }
      else {
        uVar19 = 0;
      }
      xmlStrcasecmp(uVar18,uVar19);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar9 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrcasecmp",(ulong)(uint)(iVar10 - iVar9));
        iVar8 = iVar8 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
      }
      uVar16 = uVar16 + 1;
      puVar20 = puVar20 + 1;
    } while (uVar16 != 5);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  iVar9 = 0;
  uVar15 = 0;
  do {
    puVar20 = &DAT_00165d70;
    uVar16 = 0;
    do {
      iVar10 = xmlMemBlocks();
      if (uVar15 < 4) {
        uVar18 = (&DAT_00165d70)[uVar15];
      }
      else {
        uVar18 = 0;
      }
      if (uVar16 < 4) {
        uVar19 = *puVar20;
      }
      else {
        uVar19 = 0;
      }
      xmlStrcasestr(uVar18,uVar19);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar10 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrcasestr",(ulong)(uint)(iVar11 - iVar10));
        iVar9 = iVar9 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
      }
      uVar16 = uVar16 + 1;
      puVar20 = puVar20 + 1;
    } while (uVar16 != 5);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  iVar22 = iVar3 + iVar22 + (uint)(iVar4 != iVar5) + iVar6 + iVar7 + local_58;
  local_58 = 0;
  uVar15 = 0;
  do {
    uVar21 = 0;
    do {
      iVar3 = xmlMemBlocks();
      if (uVar15 < 4) {
        uVar18 = (&DAT_00165d70)[uVar15];
      }
      else {
        uVar18 = 0;
      }
      uVar2 = (undefined1)(0xf82061 >> ((char)uVar21 * '\b' & 0x1fU));
      if (2 < (uint)uVar21) {
        uVar2 = 0;
      }
      xmlStrchr(uVar18,uVar2);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrchr",(ulong)(uint)(iVar4 - iVar3));
        local_58 = local_58 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d",uVar21);
        putchar(10);
      }
      uVar16 = (uint)uVar21 + 1;
      uVar21 = (ulong)uVar16;
    } while (uVar16 != 4);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar15 = 0;
  do {
    puVar20 = &DAT_00165d70;
    uVar16 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar15 < 4) {
        uVar18 = (&DAT_00165d70)[uVar15];
      }
      else {
        uVar18 = 0;
      }
      if (uVar16 < 4) {
        uVar19 = *puVar20;
      }
      else {
        uVar19 = 0;
      }
      xmlStrcmp(uVar18,uVar19);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrcmp",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
      }
      uVar16 = uVar16 + 1;
      puVar20 = puVar20 + 1;
    } while (uVar16 != 5);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  puVar20 = &DAT_00165d70;
  uVar15 = 0;
  local_48 = 0;
  do {
    iVar4 = xmlMemBlocks();
    if (uVar15 < 4) {
      uVar18 = *puVar20;
    }
    else {
      uVar18 = 0;
    }
    lVar12 = xmlStrdup(uVar18);
    if (lVar12 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlStrdup",(ulong)(uint)(iVar5 - iVar4));
      local_48 = local_48 + 1;
      printf(" %d",(ulong)uVar15);
      putchar(10);
    }
    uVar15 = uVar15 + 1;
    puVar20 = puVar20 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  puVar20 = &DAT_00165d70;
  uVar15 = 0;
  local_38 = 0;
  do {
    iVar4 = xmlMemBlocks();
    if (uVar15 < 4) {
      uVar18 = *puVar20;
    }
    else {
      uVar18 = 0;
    }
    xmlStrlen(uVar18);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlStrlen",(ulong)(uint)(iVar5 - iVar4));
      local_38 = local_38 + 1;
      printf(" %d",(ulong)uVar15);
      putchar(10);
    }
    uVar15 = uVar15 + 1;
    puVar20 = puVar20 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  local_44 = 0;
  uVar15 = 0;
  do {
    iVar4 = 0;
    do {
      uVar21 = 0;
      piVar25 = &DAT_00163454;
      do {
        iVar5 = xmlMemBlocks();
        if (uVar15 < 4) {
          uVar18 = (&DAT_00165d70)[uVar15];
        }
        else {
          uVar18 = 0;
        }
        switch(iVar4) {
        case 0:
          bVar1 = false;
          pcVar23 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar23 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar23 = anon_var_dwarf_1b3;
          break;
        case 3:
          bVar1 = false;
          pcVar23 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar23 = (char *)0x0;
        }
        iVar6 = -1;
        if ((uint)uVar21 < 4) {
          iVar6 = *piVar25;
        }
        if ((bVar1) || (sVar13 = strlen(pcVar23), iVar6 <= (int)sVar13 + 1)) {
          xmlStrncasecmp(uVar18,pcVar23,iVar6);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar5 != iVar6) {
            iVar6 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlStrncasecmp",(ulong)(uint)(iVar6 - iVar5));
            local_44 = local_44 + 1;
            printf(" %d",(ulong)uVar15);
            printf(" %d",iVar4);
            printf(" %d",uVar21);
            putchar(10);
          }
        }
        uVar16 = (uint)uVar21 + 1;
        uVar21 = (ulong)uVar16;
        piVar25 = piVar25 + 1;
      } while (uVar16 != 4);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 5);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  iVar22 = iVar22 + iVar8 + iVar9 + local_58 + iVar3 + local_48;
  local_48 = 0;
  uVar15 = 0;
  do {
    iVar3 = 0;
    do {
      uVar21 = 0;
      piVar25 = &DAT_00163454;
      do {
        iVar4 = xmlMemBlocks();
        if (uVar15 < 4) {
          uVar18 = (&DAT_00165d70)[uVar15];
        }
        else {
          uVar18 = 0;
        }
        switch(iVar3) {
        case 0:
          bVar1 = false;
          pcVar23 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar23 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar23 = anon_var_dwarf_1b3;
          break;
        case 3:
          bVar1 = false;
          pcVar23 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar23 = (char *)0x0;
        }
        iVar5 = -1;
        if ((uint)uVar21 < 4) {
          iVar5 = *piVar25;
        }
        if ((bVar1) || (sVar13 = strlen(pcVar23), iVar5 <= (int)sVar13 + 1)) {
          lVar12 = xmlStrncatNew(uVar18,pcVar23,iVar5);
          if (lVar12 != 0) {
            (*_xmlFree)(lVar12);
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar4 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlStrncatNew",(ulong)(uint)(iVar5 - iVar4));
            local_48 = local_48 + 1;
            printf(" %d",(ulong)uVar15);
            printf(" %d",iVar3);
            printf(" %d",uVar21);
            putchar(10);
          }
        }
        uVar16 = (uint)uVar21 + 1;
        uVar21 = (ulong)uVar16;
        piVar25 = piVar25 + 1;
      } while (uVar16 != 4);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 5);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  iVar22 = iVar22 + local_38;
  local_38 = 0;
  uVar15 = 0;
  do {
    iVar3 = 0;
    do {
      uVar21 = 0;
      piVar25 = &DAT_00163454;
      do {
        iVar4 = xmlMemBlocks();
        if (uVar15 < 4) {
          uVar18 = (&DAT_00165d70)[uVar15];
        }
        else {
          uVar18 = 0;
        }
        switch(iVar3) {
        case 0:
          bVar1 = false;
          pcVar23 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar23 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar23 = anon_var_dwarf_1b3;
          break;
        case 3:
          bVar1 = false;
          pcVar23 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar23 = (char *)0x0;
        }
        iVar5 = -1;
        if ((uint)uVar21 < 4) {
          iVar5 = *piVar25;
        }
        if ((bVar1) || (sVar13 = strlen(pcVar23), iVar5 <= (int)sVar13 + 1)) {
          xmlStrncmp(uVar18,pcVar23,iVar5);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar4 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlStrncmp",(ulong)(uint)(iVar5 - iVar4));
            local_38 = local_38 + 1;
            printf(" %d",(ulong)uVar15);
            printf(" %d",iVar3);
            printf(" %d",uVar21);
            putchar(10);
          }
        }
        uVar16 = (uint)uVar21 + 1;
        uVar21 = (ulong)uVar16;
        piVar25 = piVar25 + 1;
      } while (uVar16 != 4);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 5);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  local_34 = 0;
  uVar15 = 0;
  do {
    piVar25 = &DAT_00163454;
    uVar21 = 0;
    do {
      iVar3 = xmlMemBlocks();
      switch(uVar15) {
      case 0:
        bVar1 = false;
        pcVar23 = "foo";
        break;
      case 1:
        bVar1 = false;
        pcVar23 = "<foo/>";
        break;
      case 2:
        bVar1 = false;
        pcVar23 = anon_var_dwarf_1b3;
        break;
      case 3:
        bVar1 = false;
        pcVar23 = " 2ab ";
        break;
      default:
        bVar1 = true;
        pcVar23 = (char *)0x0;
      }
      iVar4 = -1;
      if ((uint)uVar21 < 4) {
        iVar4 = *piVar25;
      }
      if ((bVar1) || (sVar13 = strlen(pcVar23), iVar4 <= (int)sVar13 + 1)) {
        lVar12 = xmlStrndup(pcVar23,iVar4);
        if (lVar12 != 0) {
          (*_xmlFree)(lVar12);
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStrndup",(ulong)(uint)(iVar4 - iVar3));
          local_34 = local_34 + 1;
          printf(" %d",(ulong)uVar15);
          printf(" %d",uVar21);
          putchar(10);
        }
      }
      uVar16 = (uint)uVar21 + 1;
      uVar21 = (ulong)uVar16;
      piVar25 = piVar25 + 1;
    } while (uVar16 != 4);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  iVar22 = iVar22 + local_44 + local_48;
  function_tests = function_tests + 1;
  local_48 = 0;
  uVar15 = 0;
  do {
    puVar20 = &DAT_00165d70;
    uVar16 = 0;
    do {
      iVar3 = xmlMemBlocks();
      if (uVar15 < 4) {
        uVar18 = (&DAT_00165d70)[uVar15];
      }
      else {
        uVar18 = 0;
      }
      if (uVar16 < 4) {
        uVar19 = *puVar20;
      }
      else {
        uVar19 = 0;
      }
      xmlStrstr(uVar18,uVar19);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrstr",(ulong)(uint)(iVar4 - iVar3));
        local_48 = local_48 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
      }
      uVar16 = uVar16 + 1;
      puVar20 = puVar20 + 1;
    } while (uVar16 != 5);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  local_44 = 0;
  iVar3 = 0;
  do {
    uVar15 = 0;
    do {
      uVar21 = 0;
      piVar25 = &DAT_00163454;
      do {
        iVar4 = xmlMemBlocks();
        switch(iVar3) {
        case 0:
          bVar1 = false;
          pcVar23 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar23 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar23 = anon_var_dwarf_1b3;
          break;
        case 3:
          bVar1 = false;
          pcVar23 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar23 = (char *)0x0;
        }
        iVar6 = -1;
        iVar5 = -1;
        if (uVar15 < 4) {
          iVar5 = (&DAT_00163454)[uVar15];
        }
        if ((uint)uVar21 < 4) {
          iVar6 = *piVar25;
        }
        if (bVar1) {
LAB_00144ee9:
          lVar12 = xmlStrsub(pcVar23,iVar5,iVar6);
          if (lVar12 != 0) {
            (*_xmlFree)(lVar12);
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar4 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlStrsub",(ulong)(uint)(iVar5 - iVar4));
            local_44 = local_44 + 1;
            printf(" %d",iVar3);
            printf(" %d",(ulong)uVar15);
            printf(" %d",uVar21);
            putchar(10);
          }
        }
        else {
          sVar13 = strlen(pcVar23);
          iVar7 = (int)sVar13 + 1;
          if ((iVar5 <= iVar7) && (iVar6 <= iVar7)) goto LAB_00144ee9;
        }
        uVar16 = (uint)uVar21 + 1;
        uVar21 = (ulong)uVar16;
        piVar25 = piVar25 + 1;
      } while (uVar16 != 4);
      uVar15 = uVar15 + 1;
    } while (uVar15 != 4);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 5);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar15 = 0;
  do {
    puVar20 = &DAT_00165d70;
    uVar16 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar15 < 4) {
        uVar18 = (&DAT_00165d70)[uVar15];
      }
      else {
        uVar18 = 0;
      }
      if (uVar16 < 4) {
        uVar19 = *puVar20;
      }
      else {
        uVar19 = 0;
      }
      xmlUTF8Charcmp(uVar18,uVar19);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlUTF8Charcmp",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
      }
      uVar16 = uVar16 + 1;
      puVar20 = puVar20 + 1;
    } while (uVar16 != 5);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  puVar20 = &DAT_00165d70;
  uVar15 = 0;
  iVar4 = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (uVar15 < 4) {
      uVar18 = *puVar20;
    }
    else {
      uVar18 = 0;
    }
    xmlUTF8Size(uVar18);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlUTF8Size",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d",(ulong)uVar15);
      putchar(10);
    }
    uVar15 = uVar15 + 1;
    puVar20 = puVar20 + 1;
  } while (uVar15 != 5);
  iVar22 = iVar22 + local_38 + local_34 + local_48 + local_44;
  function_tests = function_tests + 1;
  puVar20 = &DAT_00165d70;
  uVar15 = 0;
  local_44 = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (uVar15 < 4) {
      uVar18 = *puVar20;
    }
    else {
      uVar18 = 0;
    }
    xmlUTF8Strlen(uVar18);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlUTF8Strlen",(ulong)(uint)(iVar6 - iVar5));
      local_44 = local_44 + 1;
      printf(" %d",(ulong)uVar15);
      putchar(10);
    }
    uVar15 = uVar15 + 1;
    puVar20 = puVar20 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  local_50 = 0;
  uVar15 = 0;
  do {
    puVar20 = &DAT_00165d70;
    uVar16 = 0;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar15 < 4) {
        uVar18 = (&DAT_00165d70)[uVar15];
      }
      else {
        uVar18 = 0;
      }
      if (uVar16 < 4) {
        uVar19 = *puVar20;
      }
      else {
        uVar19 = 0;
      }
      xmlUTF8Strloc(uVar18,uVar19);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlUTF8Strloc",(ulong)(uint)(iVar6 - iVar5));
        local_50 = local_50 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
      }
      uVar16 = uVar16 + 1;
      puVar20 = puVar20 + 1;
    } while (uVar16 != 5);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar15 = 0;
  do {
    piVar25 = &DAT_00163454;
    uVar21 = 0;
    do {
      iVar6 = xmlMemBlocks();
      switch(uVar15) {
      case 0:
        bVar1 = false;
        pcVar23 = "foo";
        break;
      case 1:
        bVar1 = false;
        pcVar23 = "<foo/>";
        break;
      case 2:
        bVar1 = false;
        pcVar23 = anon_var_dwarf_1b3;
        break;
      case 3:
        bVar1 = false;
        pcVar23 = " 2ab ";
        break;
      default:
        bVar1 = true;
        pcVar23 = (char *)0x0;
      }
      iVar7 = -1;
      if ((uint)uVar21 < 4) {
        iVar7 = *piVar25;
      }
      if ((bVar1) || (sVar13 = strlen(pcVar23), iVar7 <= (int)sVar13 + 1)) {
        lVar12 = xmlUTF8Strndup(pcVar23,iVar7);
        if (lVar12 != 0) {
          (*_xmlFree)(lVar12);
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlUTF8Strndup",(ulong)(uint)(iVar7 - iVar6));
          iVar5 = iVar5 + 1;
          printf(" %d",(ulong)uVar15);
          printf(" %d",uVar21);
          putchar(10);
        }
      }
      uVar16 = (uint)uVar21 + 1;
      uVar21 = (ulong)uVar16;
      piVar25 = piVar25 + 1;
    } while (uVar16 != 4);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  iVar22 = iVar22 + iVar3 + iVar4 + local_44;
  local_48 = 0;
  uVar15 = 0;
  do {
    puVar24 = &DAT_00163454;
    uVar16 = 0;
    do {
      iVar3 = xmlMemBlocks();
      if (uVar15 < 4) {
        uVar18 = (&DAT_00165d70)[uVar15];
      }
      else {
        uVar18 = 0;
      }
      uVar17 = 0xffffffff;
      if (uVar16 < 4) {
        uVar17 = *puVar24;
      }
      xmlUTF8Strpos(uVar18,uVar17);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlUTF8Strpos",(ulong)(uint)(iVar4 - iVar3));
        local_48 = local_48 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d",(ulong)uVar16);
        putchar(10);
      }
      uVar16 = uVar16 + 1;
      puVar24 = puVar24 + 1;
    } while (uVar16 != 4);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  local_38 = 0;
  uVar15 = 0;
  do {
    piVar25 = &DAT_00163454;
    uVar21 = 0;
    do {
      iVar3 = xmlMemBlocks();
      switch(uVar15) {
      case 0:
        bVar1 = false;
        pcVar23 = "foo";
        break;
      case 1:
        bVar1 = false;
        pcVar23 = "<foo/>";
        break;
      case 2:
        bVar1 = false;
        pcVar23 = anon_var_dwarf_1b3;
        break;
      case 3:
        bVar1 = false;
        pcVar23 = " 2ab ";
        break;
      default:
        bVar1 = true;
        pcVar23 = (char *)0x0;
      }
      iVar4 = -1;
      if ((uint)uVar21 < 4) {
        iVar4 = *piVar25;
      }
      if ((bVar1) || (sVar13 = strlen(pcVar23), iVar4 <= (int)sVar13 + 1)) {
        xmlUTF8Strsize(pcVar23,iVar4);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlUTF8Strsize",(ulong)(uint)(iVar4 - iVar3));
          local_38 = local_38 + 1;
          printf(" %d",(ulong)uVar15);
          printf(" %d",uVar21);
          putchar(10);
        }
      }
      uVar16 = (uint)uVar21 + 1;
      uVar21 = (ulong)uVar16;
      piVar25 = piVar25 + 1;
    } while (uVar16 != 4);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  function_tests = function_tests + 1;
  local_44 = 0;
  iVar3 = 0;
  do {
    uVar15 = 0;
    do {
      uVar21 = 0;
      piVar25 = &DAT_00163454;
      do {
        iVar4 = xmlMemBlocks();
        switch(iVar3) {
        case 0:
          bVar1 = false;
          pcVar23 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar23 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar23 = anon_var_dwarf_1b3;
          break;
        case 3:
          bVar1 = false;
          pcVar23 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar23 = (char *)0x0;
        }
        iVar7 = -1;
        iVar6 = -1;
        if (uVar15 < 4) {
          iVar6 = (&DAT_00163454)[uVar15];
        }
        if ((uint)uVar21 < 4) {
          iVar7 = *piVar25;
        }
        if (bVar1) {
LAB_00145643:
          lVar12 = xmlUTF8Strsub(pcVar23,iVar6,iVar7);
          if (lVar12 != 0) {
            (*_xmlFree)(lVar12);
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar4 != iVar6) {
            iVar6 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlUTF8Strsub",(ulong)(uint)(iVar6 - iVar4));
            local_44 = local_44 + 1;
            printf(" %d",iVar3);
            printf(" %d",(ulong)uVar15);
            printf(" %d",uVar21);
            putchar(10);
          }
        }
        else {
          sVar13 = strlen(pcVar23);
          iVar8 = (int)sVar13 + 1;
          if ((iVar6 <= iVar8) && (iVar7 <= iVar8)) goto LAB_00145643;
        }
        uVar16 = (uint)uVar21 + 1;
        uVar21 = (ulong)uVar16;
        piVar25 = piVar25 + 1;
      } while (uVar16 != 4);
      uVar15 = uVar15 + 1;
    } while (uVar15 != 4);
    iVar3 = iVar3 + 1;
    if (iVar3 == 5) {
      function_tests = function_tests + 1;
      uVar15 = iVar22 + local_50 + iVar5 + local_48 + local_38 + local_44;
      if (uVar15 != 0) {
        printf("Module xmlstring: %d errors\n",(ulong)uVar15);
      }
      return uVar15;
    }
  } while( true );
}

Assistant:

static int
test_xmlstring(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlstring : 26 of 30 functions ...\n");
    test_ret += test_xmlCharStrdup();
    test_ret += test_xmlCharStrndup();
    test_ret += test_xmlCheckUTF8();
    test_ret += test_xmlGetUTF8Char();
    test_ret += test_xmlStrEqual();
    test_ret += test_xmlStrPrintf();
    test_ret += test_xmlStrQEqual();
    test_ret += test_xmlStrVPrintf();
    test_ret += test_xmlStrcasecmp();
    test_ret += test_xmlStrcasestr();
    test_ret += test_xmlStrchr();
    test_ret += test_xmlStrcmp();
    test_ret += test_xmlStrdup();
    test_ret += test_xmlStrlen();
    test_ret += test_xmlStrncasecmp();
    test_ret += test_xmlStrncatNew();
    test_ret += test_xmlStrncmp();
    test_ret += test_xmlStrndup();
    test_ret += test_xmlStrstr();
    test_ret += test_xmlStrsub();
    test_ret += test_xmlUTF8Charcmp();
    test_ret += test_xmlUTF8Size();
    test_ret += test_xmlUTF8Strlen();
    test_ret += test_xmlUTF8Strloc();
    test_ret += test_xmlUTF8Strndup();
    test_ret += test_xmlUTF8Strpos();
    test_ret += test_xmlUTF8Strsize();
    test_ret += test_xmlUTF8Strsub();

    if (test_ret != 0)
	printf("Module xmlstring: %d errors\n", test_ret);
    return(test_ret);
}